

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O2

void __thiscall
Apple::II::Video::VideoBase::VideoBase(VideoBase *this,bool is_iie,function<void_(Cycles)> *target)

{
  VideoSwitches<Cycles>::VideoSwitches(&this->super_VideoSwitches<Cycles>,is_iie,(Cycles)0x2,target)
  ;
  Outputs::CRT::CRT::CRT(&this->crt_,0x38e,1,NTSC60,Luminance1);
  this->use_square_pixels_ = false;
  this->pixel_pointer_ = (uint8_t *)0x0;
  this->row_ = 0;
  this->column_ = 0;
  this->graphics_carry_ = '\0';
  this->was_double_ = false;
  this->is_iie_ = is_iie;
  Outputs::CRT::CRT::set_display_type(&this->crt_,CompositeColour);
  set_use_square_pixels(this,this->use_square_pixels_);
  return;
}

Assistant:

VideoBase::VideoBase(bool is_iie, std::function<void(Cycles)> &&target) :
	VideoSwitches<Cycles>(is_iie, Cycles(2), std::move(target)),
	crt_(910, 1, Outputs::Display::Type::NTSC60, Outputs::Display::InputDataType::Luminance1),
	is_iie_(is_iie) {

	crt_.set_display_type(Outputs::Display::DisplayType::CompositeColour);
	set_use_square_pixels(use_square_pixels_);

	// TODO: there seems to be some sort of bug whereby switching modes can cause
	// a signal discontinuity that knocks phase out of whack. So it isn't safe to
	// use default_colour_bursts elsewhere, though it otherwise should be. If/when
	// it is, start doing so and return to setting the immediate phase up here.
//	crt_.set_immediate_default_phase(0.5f);
}